

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::sse2::DiscMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  byte bVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  uint uVar22;
  undefined4 uVar23;
  ulong uVar24;
  RTCFilterFunctionN p_Var25;
  RayHitK<4> *pRVar26;
  long lVar27;
  Scene *pSVar28;
  long lVar29;
  float fVar30;
  float fVar38;
  float fVar39;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar56 [16];
  float fVar60;
  float fVar61;
  uint uVar62;
  float fVar63;
  uint uVar64;
  float fVar65;
  uint uVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar77 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  uint local_1a8 [4];
  undefined8 local_198;
  undefined8 uStack_190;
  RayQueryContext *local_188;
  Scene *local_180;
  RTCFilterFunctionNArguments local_178;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118 [4];
  float local_108 [4];
  float local_f8 [4];
  float local_e8 [4];
  uint local_d8 [4];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar28 = context->scene;
  local_d8[0] = Disc->sharedGeomID;
  pGVar10 = (pSVar28->geometries).items[local_d8[0]].ptr;
  lVar27 = *(long *)&pGVar10->field_0x58;
  _Var11 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(lVar27 + (Disc->primIDs).field_0.i[0] * _Var11);
  pfVar2 = (float *)(lVar27 + (Disc->primIDs).field_0.i[1] * _Var11);
  pfVar3 = (float *)(lVar27 + (Disc->primIDs).field_0.i[2] * _Var11);
  pfVar4 = (float *)(lVar27 + (Disc->primIDs).field_0.i[3] * _Var11);
  bVar9 = Disc->numPrimitives;
  local_d8[1] = local_d8[0];
  local_d8[2] = local_d8[0];
  local_d8[3] = local_d8[0];
  fVar54 = *(float *)(ray + k * 4);
  fVar48 = *(float *)(ray + k * 4 + 0x10);
  fVar59 = *(float *)(ray + k * 4 + 0x20);
  fVar30 = *(float *)(ray + k * 4 + 0x30);
  fVar49 = *pfVar1 - fVar54;
  fVar52 = *pfVar2 - fVar54;
  fVar53 = *pfVar3 - fVar54;
  fVar54 = *pfVar4 - fVar54;
  fVar40 = pfVar1[1] - fVar48;
  fVar46 = pfVar2[1] - fVar48;
  fVar47 = pfVar3[1] - fVar48;
  fVar48 = pfVar4[1] - fVar48;
  fVar55 = pfVar1[2] - fVar59;
  fVar57 = pfVar2[2] - fVar59;
  fVar58 = pfVar3[2] - fVar59;
  fVar59 = pfVar4[2] - fVar59;
  fVar5 = *(float *)(ray + k * 4 + 0x40);
  fVar6 = *(float *)(ray + k * 4 + 0x50);
  fVar7 = *(float *)(ray + k * 4 + 0x60);
  fVar76 = fVar6 * fVar6 + fVar7 * fVar7;
  fVar75 = fVar5 * fVar5 + fVar76;
  auVar77._4_4_ = fVar75;
  auVar77._0_4_ = fVar75;
  auVar77._8_4_ = fVar75;
  auVar77._12_4_ = fVar75;
  auVar77 = rcpps(ZEXT416((uint)fVar76),auVar77);
  fVar76 = auVar77._0_4_;
  fVar78 = auVar77._4_4_;
  fVar79 = auVar77._8_4_;
  fVar80 = auVar77._12_4_;
  fVar76 = (fVar49 * fVar5 + fVar40 * fVar6 + fVar55 * fVar7) *
           ((1.0 - fVar75 * fVar76) * fVar76 + fVar76);
  fVar78 = (fVar52 * fVar5 + fVar46 * fVar6 + fVar57 * fVar7) *
           ((1.0 - fVar75 * fVar78) * fVar78 + fVar78);
  fVar79 = (fVar53 * fVar5 + fVar47 * fVar6 + fVar58 * fVar7) *
           ((1.0 - fVar75 * fVar79) * fVar79 + fVar79);
  fVar80 = (fVar54 * fVar5 + fVar48 * fVar6 + fVar59 * fVar7) *
           ((1.0 - fVar75 * fVar80) * fVar80 + fVar80);
  fVar75 = *(float *)(ray + k * 4 + 0x80);
  bVar17 = (fVar76 <= fVar75 && fVar30 <= fVar76) && bVar9 != 0;
  bVar18 = (fVar78 <= fVar75 && fVar30 <= fVar78) && 1 < bVar9;
  bVar19 = (fVar79 <= fVar75 && fVar30 <= fVar79) && 2 < bVar9;
  bVar20 = (fVar80 <= fVar75 && fVar30 <= fVar80) && 3 < bVar9;
  auVar16._4_4_ = -(uint)bVar18;
  auVar16._0_4_ = -(uint)bVar17;
  auVar16._8_4_ = -(uint)bVar19;
  auVar16._12_4_ = -(uint)bVar20;
  iVar21 = movmskps(local_d8[0],auVar16);
  if (iVar21 != 0) {
    fVar60 = fVar49 - fVar5 * fVar76;
    fVar61 = fVar52 - fVar5 * fVar78;
    fVar63 = fVar53 - fVar5 * fVar79;
    fVar65 = fVar54 - fVar5 * fVar80;
    fVar67 = fVar40 - fVar6 * fVar76;
    fVar68 = fVar46 - fVar6 * fVar78;
    fVar69 = fVar47 - fVar6 * fVar79;
    fVar70 = fVar48 - fVar6 * fVar80;
    fVar71 = fVar55 - fVar7 * fVar76;
    fVar72 = fVar57 - fVar7 * fVar78;
    fVar73 = fVar58 - fVar7 * fVar79;
    fVar74 = fVar59 - fVar7 * fVar80;
    fVar30 = pfVar1[3] * pfVar1[3];
    fVar75 = pfVar2[3] * pfVar2[3];
    fVar38 = pfVar3[3] * pfVar3[3];
    fVar39 = pfVar4[3] * pfVar4[3];
    bVar17 = fVar60 * fVar60 + fVar67 * fVar67 + fVar71 * fVar71 <= fVar30 && bVar17;
    bVar18 = fVar61 * fVar61 + fVar68 * fVar68 + fVar72 * fVar72 <= fVar75 && bVar18;
    bVar19 = fVar63 * fVar63 + fVar69 * fVar69 + fVar73 * fVar73 <= fVar38 && bVar19;
    bVar20 = fVar65 * fVar65 + fVar70 * fVar70 + fVar74 * fVar74 <= fVar39 && bVar20;
    auVar12._4_4_ = -(uint)bVar18;
    auVar12._0_4_ = -(uint)bVar17;
    auVar12._8_4_ = -(uint)bVar19;
    auVar12._12_4_ = -(uint)bVar20;
    iVar21 = movmskps(iVar21,auVar12);
    if (iVar21 != 0) {
      bVar17 = fVar30 < fVar49 * fVar49 + fVar40 * fVar40 + fVar55 * fVar55 && bVar17;
      local_1a8[0] = -(uint)bVar17;
      bVar18 = fVar75 < fVar52 * fVar52 + fVar46 * fVar46 + fVar57 * fVar57 && bVar18;
      local_1a8[1] = -(uint)bVar18;
      bVar19 = fVar38 < fVar53 * fVar53 + fVar47 * fVar47 + fVar58 * fVar58 && bVar19;
      local_1a8[2] = -(uint)bVar19;
      bVar20 = fVar39 < fVar54 * fVar54 + fVar48 * fVar48 + fVar59 * fVar59 && bVar20;
      local_1a8[3] = -(uint)bVar20;
      auVar13._4_4_ = local_1a8[1];
      auVar13._0_4_ = local_1a8[0];
      auVar13._8_4_ = local_1a8[2];
      auVar13._12_4_ = local_1a8[3];
      iVar21 = movmskps(iVar21,auVar13);
      if (iVar21 != 0) {
        local_128 = 0;
        uStack_120 = 0;
        local_138 = 0;
        uStack_130 = 0;
        local_118[0] = fVar76;
        local_118[1] = fVar78;
        local_118[2] = fVar79;
        local_118[3] = fVar80;
        local_108[0] = -fVar5;
        local_108[1] = -fVar5;
        local_108[2] = -fVar5;
        local_108[3] = -fVar5;
        local_f8[0] = -fVar6;
        local_f8[1] = -fVar6;
        local_f8[2] = -fVar6;
        local_f8[3] = -fVar6;
        local_e8[0] = -fVar7;
        local_e8[1] = -fVar7;
        local_e8[2] = -fVar7;
        local_e8[3] = -fVar7;
        auVar31._0_4_ = (uint)fVar76 & local_1a8[0];
        auVar31._4_4_ = (uint)fVar78 & local_1a8[1];
        auVar31._8_4_ = (uint)fVar79 & local_1a8[2];
        auVar31._12_4_ = (uint)fVar80 & local_1a8[3];
        auVar41._0_8_ = CONCAT44(~local_1a8[1],~local_1a8[0]) & 0x7f8000007f800000;
        auVar41._8_4_ = ~local_1a8[2] & 0x7f800000;
        auVar41._12_4_ = ~local_1a8[3] & 0x7f800000;
        auVar41 = auVar41 | auVar31;
        auVar50._4_4_ = auVar41._0_4_;
        auVar50._0_4_ = auVar41._4_4_;
        auVar50._8_4_ = auVar41._12_4_;
        auVar50._12_4_ = auVar41._8_4_;
        auVar77 = minps(auVar50,auVar41);
        auVar32._0_8_ = auVar77._8_8_;
        auVar32._8_4_ = auVar77._0_4_;
        auVar32._12_4_ = auVar77._4_4_;
        auVar77 = minps(auVar32,auVar77);
        auVar33._0_4_ = -(uint)(auVar77._0_4_ == auVar41._0_4_ && bVar17);
        auVar33._4_4_ = -(uint)(auVar77._4_4_ == auVar41._4_4_ && bVar18);
        auVar33._8_4_ = -(uint)(auVar77._8_4_ == auVar41._8_4_ && bVar19);
        auVar33._12_4_ = -(uint)(auVar77._12_4_ == auVar41._12_4_ && bVar20);
        iVar21 = movmskps(iVar21,auVar33);
        uVar22 = local_1a8[0];
        uVar62 = local_1a8[1];
        uVar64 = local_1a8[2];
        uVar66 = local_1a8[3];
        if (iVar21 != 0) {
          uVar22 = auVar33._0_4_;
          uVar62 = auVar33._4_4_;
          uVar64 = auVar33._8_4_;
          uVar66 = auVar33._12_4_;
        }
        auVar14._4_4_ = uVar62;
        auVar14._0_4_ = uVar22;
        auVar14._8_4_ = uVar64;
        auVar14._12_4_ = uVar66;
        uVar22 = movmskps(iVar21,auVar14);
        lVar27 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
          }
        }
        lVar29 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
        do {
          local_178.hit = (RTCHitN *)&local_c8;
          local_178.valid = (int *)&local_198;
          local_68 = local_d8[lVar27];
          uVar24 = (ulong)local_68;
          pGVar10 = (pSVar28->geometries).items[uVar24].ptr;
          if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            local_1a8[lVar27] = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar23 = *(undefined4 *)((long)&local_138 + lVar27 * 4);
              uVar8 = *(undefined4 *)((long)&local_128 + lVar27 * 4);
              *(float *)(ray + k * 4 + 0x80) = local_118[lVar27];
              *(float *)(ray + k * 4 + 0xc0) = local_108[lVar27];
              *(float *)(ray + k * 4 + 0xd0) = local_f8[lVar27];
              *(float *)(ray + k * 4 + 0xe0) = local_e8[lVar27];
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar23;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
              *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar27];
              *(uint *)(ray + k * 4 + 0x120) = local_68;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              return;
            }
            local_98 = *(undefined4 *)((long)&local_138 + lVar27 * 4);
            local_88 = *(undefined4 *)((long)&local_128 + lVar27 * 4);
            local_c8 = local_108[lVar27];
            local_b8 = local_f8[lVar27];
            local_78 = (Disc->primIDs).field_0.i[lVar27];
            local_a8 = local_e8[lVar27];
            fStack_c4 = local_c8;
            fStack_c0 = local_c8;
            fStack_bc = local_c8;
            fStack_b4 = local_b8;
            fStack_b0 = local_b8;
            fStack_ac = local_b8;
            fStack_a4 = local_a8;
            fStack_a0 = local_a8;
            fStack_9c = local_a8;
            uStack_94 = local_98;
            uStack_90 = local_98;
            uStack_8c = local_98;
            uStack_84 = local_88;
            uStack_80 = local_88;
            uStack_7c = local_88;
            uStack_74 = local_78;
            uStack_70 = local_78;
            uStack_6c = local_78;
            uStack_64 = local_68;
            uStack_60 = local_68;
            uStack_5c = local_68;
            local_58 = context->user->instID[0];
            uStack_54 = local_58;
            uStack_50 = local_58;
            uStack_4c = local_58;
            local_48 = context->user->instPrimID[0];
            uStack_44 = local_48;
            uStack_40 = local_48;
            uStack_3c = local_48;
            uVar23 = *(undefined4 *)(ray + k * 4 + 0x80);
            *(float *)(ray + k * 4 + 0x80) = local_118[lVar27];
            local_198 = *(undefined8 *)(mm_lookupmask_ps + lVar29);
            uStack_190 = *(undefined8 *)(mm_lookupmask_ps + lVar29 + 8);
            local_178.geometryUserPtr = pGVar10->userPtr;
            local_178.context = context->user;
            local_178.N = 4;
            p_Var25 = pGVar10->intersectionFilterN;
            local_188 = context;
            local_178.ray = (RTCRayN *)ray;
            local_148 = fVar76;
            fStack_144 = fVar78;
            fStack_140 = fVar79;
            fStack_13c = fVar80;
            if (p_Var25 != (RTCFilterFunctionN)0x0) {
              local_180 = pSVar28;
              p_Var25 = (RTCFilterFunctionN)(*p_Var25)(&local_178);
              pSVar28 = local_180;
            }
            auVar34._0_4_ = -(uint)((int)local_198 == 0);
            auVar34._4_4_ = -(uint)(local_198._4_4_ == 0);
            auVar34._8_4_ = -(uint)((int)uStack_190 == 0);
            auVar34._12_4_ = -(uint)(uStack_190._4_4_ == 0);
            uVar22 = movmskps((int)p_Var25,auVar34);
            pRVar26 = (RayHitK<4> *)(ulong)(uVar22 ^ 0xf);
            if ((uVar22 ^ 0xf) == 0) {
              auVar15._8_4_ = 0xffffffff;
              auVar15._0_8_ = 0xffffffffffffffff;
              auVar15._12_4_ = 0xffffffff;
              auVar35 = auVar34 ^ auVar15;
              context = local_188;
              fVar76 = local_148;
              fVar78 = fStack_144;
              fVar79 = fStack_140;
              fVar80 = fStack_13c;
            }
            else {
              p_Var25 = local_188->args->filter;
              if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                 (((local_188->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0))))
              {
                p_Var25 = (RTCFilterFunctionN)(*p_Var25)(&local_178);
              }
              auVar42._0_4_ = -(uint)((int)local_198 == 0);
              auVar42._4_4_ = -(uint)(local_198._4_4_ == 0);
              auVar42._8_4_ = -(uint)((int)uStack_190 == 0);
              auVar42._12_4_ = -(uint)(uStack_190._4_4_ == 0);
              auVar35._8_4_ = 0xffffffff;
              auVar35._0_8_ = 0xffffffffffffffff;
              auVar35._12_4_ = 0xffffffff;
              auVar35 = auVar42 ^ auVar35;
              uVar22 = movmskps((int)p_Var25,auVar42);
              pRVar26 = (RayHitK<4> *)(ulong)(uVar22 ^ 0xf);
              context = local_188;
              fVar76 = local_148;
              fVar78 = fStack_144;
              fVar79 = fStack_140;
              fVar80 = fStack_13c;
              if ((uVar22 ^ 0xf) != 0) {
                fVar54 = *(float *)(local_178.hit + 4);
                fVar48 = *(float *)(local_178.hit + 8);
                fVar59 = *(float *)(local_178.hit + 0xc);
                *(uint *)(local_178.ray + 0xc0) =
                     ~auVar42._0_4_ & (uint)*(float *)local_178.hit |
                     *(uint *)(local_178.ray + 0xc0) & auVar42._0_4_;
                *(uint *)(local_178.ray + 0xc4) =
                     ~auVar42._4_4_ & (uint)fVar54 | *(uint *)(local_178.ray + 0xc4) & auVar42._4_4_
                ;
                *(uint *)(local_178.ray + 200) =
                     ~auVar42._8_4_ & (uint)fVar48 | *(uint *)(local_178.ray + 200) & auVar42._8_4_;
                *(uint *)(local_178.ray + 0xcc) =
                     ~auVar42._12_4_ & (uint)fVar59 |
                     *(uint *)(local_178.ray + 0xcc) & auVar42._12_4_;
                fVar54 = *(float *)(local_178.hit + 0x14);
                fVar48 = *(float *)(local_178.hit + 0x18);
                fVar59 = *(float *)(local_178.hit + 0x1c);
                *(uint *)(local_178.ray + 0xd0) =
                     ~auVar42._0_4_ & (uint)*(float *)(local_178.hit + 0x10) |
                     *(uint *)(local_178.ray + 0xd0) & auVar42._0_4_;
                *(uint *)(local_178.ray + 0xd4) =
                     ~auVar42._4_4_ & (uint)fVar54 | *(uint *)(local_178.ray + 0xd4) & auVar42._4_4_
                ;
                *(uint *)(local_178.ray + 0xd8) =
                     ~auVar42._8_4_ & (uint)fVar48 | *(uint *)(local_178.ray + 0xd8) & auVar42._8_4_
                ;
                *(uint *)(local_178.ray + 0xdc) =
                     ~auVar42._12_4_ & (uint)fVar59 |
                     *(uint *)(local_178.ray + 0xdc) & auVar42._12_4_;
                *(undefined1 (*) [16])(local_178.ray + 0xe0) =
                     ~auVar42 & *(undefined1 (*) [16])(local_178.hit + 0x20) |
                     *(undefined1 (*) [16])(local_178.ray + 0xe0) & auVar42;
                *(undefined1 (*) [16])(local_178.ray + 0xf0) =
                     ~auVar42 & *(undefined1 (*) [16])(local_178.hit + 0x30) |
                     *(undefined1 (*) [16])(local_178.ray + 0xf0) & auVar42;
                fVar54 = *(float *)(local_178.hit + 0x44);
                fVar48 = *(float *)(local_178.hit + 0x48);
                fVar59 = *(float *)(local_178.hit + 0x4c);
                *(uint *)(local_178.ray + 0x100) =
                     ~auVar42._0_4_ & (uint)*(float *)(local_178.hit + 0x40) |
                     *(uint *)(local_178.ray + 0x100) & auVar42._0_4_;
                *(uint *)(local_178.ray + 0x104) =
                     ~auVar42._4_4_ & (uint)fVar54 |
                     *(uint *)(local_178.ray + 0x104) & auVar42._4_4_;
                *(uint *)(local_178.ray + 0x108) =
                     ~auVar42._8_4_ & (uint)fVar48 |
                     *(uint *)(local_178.ray + 0x108) & auVar42._8_4_;
                *(uint *)(local_178.ray + 0x10c) =
                     ~auVar42._12_4_ & (uint)fVar59 |
                     *(uint *)(local_178.ray + 0x10c) & auVar42._12_4_;
                fVar54 = *(float *)(local_178.hit + 0x54);
                fVar48 = *(float *)(local_178.hit + 0x58);
                fVar59 = *(float *)(local_178.hit + 0x5c);
                *(uint *)(local_178.ray + 0x110) =
                     *(uint *)(local_178.ray + 0x110) & auVar42._0_4_ |
                     ~auVar42._0_4_ & (uint)*(float *)(local_178.hit + 0x50);
                *(uint *)(local_178.ray + 0x114) =
                     *(uint *)(local_178.ray + 0x114) & auVar42._4_4_ |
                     ~auVar42._4_4_ & (uint)fVar54;
                *(uint *)(local_178.ray + 0x118) =
                     *(uint *)(local_178.ray + 0x118) & auVar42._8_4_ |
                     ~auVar42._8_4_ & (uint)fVar48;
                *(uint *)(local_178.ray + 0x11c) =
                     *(uint *)(local_178.ray + 0x11c) & auVar42._12_4_ |
                     ~auVar42._12_4_ & (uint)fVar59;
                fVar54 = *(float *)(local_178.hit + 100);
                fVar48 = *(float *)(local_178.hit + 0x68);
                fVar59 = *(float *)(local_178.hit + 0x6c);
                *(uint *)(local_178.ray + 0x120) =
                     *(uint *)(local_178.ray + 0x120) & auVar42._0_4_ |
                     ~auVar42._0_4_ & (uint)*(float *)(local_178.hit + 0x60);
                *(uint *)(local_178.ray + 0x124) =
                     *(uint *)(local_178.ray + 0x124) & auVar42._4_4_ |
                     ~auVar42._4_4_ & (uint)fVar54;
                *(uint *)(local_178.ray + 0x128) =
                     *(uint *)(local_178.ray + 0x128) & auVar42._8_4_ |
                     ~auVar42._8_4_ & (uint)fVar48;
                *(uint *)(local_178.ray + 300) =
                     *(uint *)(local_178.ray + 300) & auVar42._12_4_ |
                     ~auVar42._12_4_ & (uint)fVar59;
                fVar54 = *(float *)(local_178.hit + 0x74);
                fVar48 = *(float *)(local_178.hit + 0x78);
                fVar59 = *(float *)(local_178.hit + 0x7c);
                *(uint *)(local_178.ray + 0x130) =
                     ~auVar42._0_4_ & (uint)*(float *)(local_178.hit + 0x70) |
                     *(uint *)(local_178.ray + 0x130) & auVar42._0_4_;
                *(uint *)(local_178.ray + 0x134) =
                     ~auVar42._4_4_ & (uint)fVar54 |
                     *(uint *)(local_178.ray + 0x134) & auVar42._4_4_;
                *(uint *)(local_178.ray + 0x138) =
                     ~auVar42._8_4_ & (uint)fVar48 |
                     *(uint *)(local_178.ray + 0x138) & auVar42._8_4_;
                *(uint *)(local_178.ray + 0x13c) =
                     ~auVar42._12_4_ & (uint)fVar59 |
                     *(uint *)(local_178.ray + 0x13c) & auVar42._12_4_;
                fVar54 = *(float *)(local_178.hit + 0x84);
                fVar48 = *(float *)(local_178.hit + 0x88);
                fVar59 = *(float *)(local_178.hit + 0x8c);
                *(uint *)(local_178.ray + 0x140) =
                     ~auVar42._0_4_ & (uint)*(float *)(local_178.hit + 0x80) |
                     *(uint *)(local_178.ray + 0x140) & auVar42._0_4_;
                *(uint *)(local_178.ray + 0x144) =
                     ~auVar42._4_4_ & (uint)fVar54 |
                     *(uint *)(local_178.ray + 0x144) & auVar42._4_4_;
                *(uint *)(local_178.ray + 0x148) =
                     ~auVar42._8_4_ & (uint)fVar48 |
                     *(uint *)(local_178.ray + 0x148) & auVar42._8_4_;
                *(uint *)(local_178.ray + 0x14c) =
                     ~auVar42._12_4_ & (uint)fVar59 |
                     *(uint *)(local_178.ray + 0x14c) & auVar42._12_4_;
                pRVar26 = (RayHitK<4> *)local_178.ray;
              }
            }
            auVar37._0_4_ = auVar35._0_4_ << 0x1f;
            auVar37._4_4_ = auVar35._4_4_ << 0x1f;
            auVar37._8_4_ = auVar35._8_4_ << 0x1f;
            auVar37._12_4_ = auVar35._12_4_ << 0x1f;
            iVar21 = movmskps((int)pRVar26,auVar37);
            uVar24 = CONCAT44((int)((ulong)pRVar26 >> 0x20),iVar21);
            if (iVar21 == 0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = uVar23;
            }
            local_1a8[lVar27] = 0;
            fVar54 = *(float *)(ray + k * 4 + 0x80);
            local_1a8[0] = -(uint)(fVar76 <= fVar54) & local_1a8[0];
            local_1a8[1] = -(uint)(fVar78 <= fVar54) & local_1a8[1];
            local_1a8[2] = -(uint)(fVar79 <= fVar54) & local_1a8[2];
            local_1a8[3] = -(uint)(fVar80 <= fVar54) & local_1a8[3];
          }
          auVar36._4_4_ = local_1a8[1];
          auVar36._0_4_ = local_1a8[0];
          auVar36._8_4_ = local_1a8[2];
          auVar36._12_4_ = local_1a8[3];
          iVar21 = movmskps((int)uVar24,auVar36);
          if (iVar21 == 0) {
            return;
          }
          auVar43._0_4_ = local_1a8[0] & (uint)fVar76;
          auVar43._4_4_ = local_1a8[1] & (uint)fVar78;
          auVar43._8_4_ = local_1a8[2] & (uint)fVar79;
          auVar43._12_4_ = local_1a8[3] & (uint)fVar80;
          auVar51._0_8_ = CONCAT44(~local_1a8[1],~local_1a8[0]) & 0x7f8000007f800000;
          auVar51._8_4_ = ~local_1a8[2] & 0x7f800000;
          auVar51._12_4_ = ~local_1a8[3] & 0x7f800000;
          auVar51 = auVar51 | auVar43;
          auVar56._4_4_ = auVar51._0_4_;
          auVar56._0_4_ = auVar51._4_4_;
          auVar56._8_4_ = auVar51._12_4_;
          auVar56._12_4_ = auVar51._8_4_;
          auVar77 = minps(auVar56,auVar51);
          auVar44._0_8_ = auVar77._8_8_;
          auVar44._8_4_ = auVar77._0_4_;
          auVar44._12_4_ = auVar77._4_4_;
          auVar77 = minps(auVar44,auVar77);
          auVar45._0_8_ =
               CONCAT44(-(uint)(auVar77._4_4_ == auVar51._4_4_) & local_1a8[1],
                        -(uint)(auVar77._0_4_ == auVar51._0_4_) & local_1a8[0]);
          auVar45._8_4_ = -(uint)(auVar77._8_4_ == auVar51._8_4_) & local_1a8[2];
          auVar45._12_4_ = -(uint)(auVar77._12_4_ == auVar51._12_4_) & local_1a8[3];
          iVar21 = movmskps(iVar21,auVar45);
          if (iVar21 != 0) {
            auVar36._8_4_ = auVar45._8_4_;
            auVar36._0_8_ = auVar45._0_8_;
            auVar36._12_4_ = auVar45._12_4_;
          }
          uVar23 = movmskps(iVar21,auVar36);
          uVar24 = CONCAT44((int)(uVar24 >> 0x20),uVar23);
          lVar27 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }